

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_layer.c
# Opt level: O1

REF_STATUS ref_layer_recon(REF_LAYER ref_layer,REF_GRID ref_grid)

{
  int iVar1;
  REF_CELL ref_cell;
  REF_NODE pRVar2;
  REF_STATUS RVar3;
  uint uVar4;
  long lVar5;
  int cell;
  long lVar6;
  char *__s;
  REF_BOOL has_side;
  REF_INT nodes [27];
  int local_b4;
  REF_CELL local_b0;
  int local_a8;
  int local_a4;
  
  ref_cell = ref_layer->ref_grid->cell[0];
  if (0 < ref_cell->max) {
    local_b0 = ref_grid->cell[8];
    pRVar2 = ref_layer->ref_grid->node;
    cell = 0;
    do {
      RVar3 = ref_cell_nodes(ref_cell,cell,&local_a8);
      if (RVar3 == 0) {
        lVar5 = 0xffffffff;
        lVar6 = 0xffffffff;
        if (((-1 < (long)local_a8) && (lVar6 = 0xffffffff, local_a8 < pRVar2->max)) &&
           (lVar6 = pRVar2->global[local_a8], lVar6 < 0)) {
          lVar6 = -1;
        }
        if (((-1 < (long)local_a4) && (local_a4 < pRVar2->max)) &&
           (lVar5 = pRVar2->global[local_a4], lVar5 < 0)) {
          lVar5 = -1;
        }
        uVar4 = ref_cell_has_side(local_b0,(REF_INT)lVar6,(REF_INT)lVar5,&local_b4);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
                 0x156,"ref_layer_recon",(ulong)uVar4,"side?");
          return uVar4;
        }
        if (local_b4 == 0) {
          iVar1 = ref_layer->verbose;
          __s = "need one";
        }
        else {
          iVar1 = ref_layer->verbose;
          __s = "got one";
        }
        if (iVar1 != 0) {
          puts(__s);
        }
      }
      cell = cell + 1;
    } while (cell < ref_cell->max);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_layer_recon(REF_LAYER ref_layer, REF_GRID ref_grid) {
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_NODE layer_node = ref_grid_node(ref_layer_grid(ref_layer));
  REF_CELL layer_edge = ref_grid_edg(ref_layer_grid(ref_layer));
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL has_side;
  REF_INT node0, node1;

  each_ref_cell_valid_cell_with_nodes(layer_edge, cell, nodes) {
    node0 = (REF_INT)ref_node_global(layer_node, nodes[0]);
    node1 = (REF_INT)ref_node_global(layer_node, nodes[1]);
    RSS(ref_cell_has_side(ref_cell, node0, node1, &has_side), "side?");
    if (has_side) {
      if (ref_layer->verbose) printf("got one\n");
    } else {
      if (ref_layer->verbose) printf("need one\n");
    }
  }

  return REF_SUCCESS;
}